

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.h
# Opt level: O2

bool __thiscall flexScore::operator>(flexScore *this,flexScore *b)

{
  if (this->extreme == true) {
    if ((b->extreme != false) && (b->favorable != false)) {
      return false;
    }
LAB_00102e99:
    return this->favorable;
  }
  if (b->extreme == false) {
    if (this->tethered == true) {
      if (this->draw == true) {
        if (b->tethered != false) {
          if (b->draw == true) {
LAB_00102e5b:
            return b->count < this->count;
          }
          goto LAB_00102e3c;
        }
      }
      else {
        if (b->tethered == false) goto LAB_00102e99;
        if (b->draw != false) {
          return this->favorable;
        }
        if (this->favorable != false) {
          if (b->favorable != false) {
            return this->count < b->count;
          }
          return true;
        }
        if (b->favorable == false) goto LAB_00102e5b;
      }
      return false;
    }
    if (b->tethered != true) {
      return b->score <= this->score && this->score != b->score;
    }
    if (b->draw != false) {
      return true;
    }
  }
LAB_00102e3c:
  return (bool)(b->favorable ^ 1);
}

Assistant:

bool operator>(const flexScore& b) { // There's probably a more readable way to do this...
    if(this->extreme) {
      if(b.extreme) {
        if(b.favorable) {
          return false;
        }
        return favorable;
      }
      return favorable;
    }
    if(b.extreme) {
      return !b.favorable;
    }
    if(this->tethered) {
      if(this->draw) {
        if(b.tethered) {
          if(b.draw) {
            return this->count > b.count;
          } else {
            return !b.favorable;
          }
        }
        return false;
      } else {
        if(b.tethered) {
          if(b.draw) {
            return this->favorable;
          } else {
            if(this->favorable) {
              if(b.favorable) {
                return this->count < b.count;
              }
              return true;
            } else {
              if(b.favorable) {
                return false;
              } else {
                return this->count > b.count;
              }
            }
          }
        } else {
          return this->favorable;
        }
      }
    } else {
      if(b.tethered) {
        if(b.draw) {
          return true;
        } else {
          return !b.favorable;
        }
      } else {
        return this->score > b.score;
      }
    }
    return false;
  }